

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> * __thiscall
cfd::core::Descriptor::GetKeyDataAll
          (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__return_storage_ptr__,
          Descriptor *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument)

{
  bool bVar1;
  DescriptorScriptReference *this_00;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  *in_stack_fffffffffffff700;
  undefined1 local_598 [8];
  KeyData key_data;
  DescriptorKeyReference *key;
  iterator __end5;
  iterator __begin5;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  *__range5;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  key_list;
  undefined1 local_3c8 [8];
  DescriptorScriptReference script_data;
  DescriptorScriptReference *ref;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  *__range2;
  undefined1 local_38 [8];
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ref_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *array_argument_local;
  Descriptor *this_local;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *result;
  
  this_00 = (DescriptorScriptReference *)__return_storage_ptr__;
  ref_list.
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)array_argument;
  GetReferenceAll((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                   *)local_38,this,array_argument);
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            (__return_storage_ptr__);
  __end2 = ::std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::begin((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                    *)local_38);
  ref = (DescriptorScriptReference *)
        ::std::
        vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
        ::end((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               *)local_38);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
                                     *)&ref), bVar1) {
    script_data.addr_prefixes_.
    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
                  ::operator*(&__end2);
    DescriptorScriptReference::DescriptorScriptReference
              ((DescriptorScriptReference *)local_3c8,
               (DescriptorScriptReference *)
               script_data.addr_prefixes_.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      bVar1 = DescriptorScriptReference::HasKey((DescriptorScriptReference *)local_3c8);
      if (bVar1) {
        DescriptorScriptReference::GetKeyList
                  ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                    *)&__range5,(DescriptorScriptReference *)local_3c8);
        __end5 = ::std::
                 vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 ::begin((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                          *)&__range5);
        key = (DescriptorKeyReference *)
              ::std::
              vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ::end((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                     *)&__range5);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
                                           *)&key), bVar1) {
          key_data.fingerprint_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)__gnu_cxx::
                        __normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
                        ::operator*(&__end5);
          DescriptorKeyReference::GetKeyData
                    ((KeyData *)local_598,
                     (DescriptorKeyReference *)
                     key_data.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
          bVar1 = KeyData::IsValid((KeyData *)local_598);
          if (bVar1) {
            ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::push_back
                      (__return_storage_ptr__,(value_type *)local_598);
          }
          KeyData::~KeyData((KeyData *)this_00);
          __gnu_cxx::
          __normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
          ::operator++(&__end5);
        }
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector(in_stack_fffffffffffff700);
      }
      bVar1 = DescriptorScriptReference::HasChild((DescriptorScriptReference *)local_3c8);
      if (!bVar1) break;
      DescriptorScriptReference::GetChild
                ((DescriptorScriptReference *)&stack0xfffffffffffff700,
                 (DescriptorScriptReference *)local_3c8);
      DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)local_3c8,
                 (DescriptorScriptReference *)&stack0xfffffffffffff700);
      DescriptorScriptReference::~DescriptorScriptReference(this_00);
    }
    DescriptorScriptReference::~DescriptorScriptReference(this_00);
    __gnu_cxx::
    __normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
    ::operator++(&__end2);
  }
  ::std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             *)local_38);
  return (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)this_00;
}

Assistant:

std::vector<KeyData> Descriptor::GetKeyDataAll(
    const std::vector<std::string>* array_argument) const {
  std::vector<DescriptorScriptReference> ref_list =
      GetReferenceAll(array_argument);
  std::vector<KeyData> result;

  for (const auto& ref : ref_list) {
    DescriptorScriptReference script_data = ref;
    do {
      if (script_data.HasKey()) {
        auto key_list = script_data.GetKeyList();
        for (const auto& key : key_list) {
          auto key_data = key.GetKeyData();
          if (key_data.IsValid()) {
            result.push_back(key_data);
          }
        }
      }
      if (!script_data.HasChild()) {
        break;
      }
      script_data = script_data.GetChild();
    } while (true);
  }
  return result;
}